

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::CheckTypes(TypeChecker *this,TypeVector *actual,TypeVector *expected)

{
  Type actual_00;
  Result rhs;
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_30;
  size_t i;
  TypeVector *expected_local;
  TypeVector *actual_local;
  TypeChecker *this_local;
  Result result;
  
  sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(actual);
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected);
  if (sVar1 == sVar2) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
    for (local_30 = 0; sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(actual),
        local_30 < sVar1; local_30 = local_30 + 1) {
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](actual,local_30);
      actual_00.enum_ = pvVar3->enum_;
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,local_30);
      rhs = CheckType(actual_00,(Type)pvVar3->enum_);
      Result::operator|=((Result *)((long)&this_local + 4),rhs);
    }
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckTypes(const TypeVector& actual,
                               const TypeVector& expected) {
  if (actual.size() != expected.size()) {
    return Result::Error;
  } else {
    Result result = Result::Ok;
    for (size_t i = 0; i < actual.size(); i++)
      result |= CheckType(actual[i], expected[i]);
    return result;
  }
}